

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_mus_midiout.cpp
# Opt level: O2

void __thiscall MUSSong2::MUSSong2(MUSSong2 *this,FileReader *reader,EMidiDevice type,char *args)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  MUSHeader *pMVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  uint uVar7;
  BYTE front [32];
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,type,args);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__MUSSong2_006ea5c8;
  this->MusHeader = (MUSHeader *)0x0;
  this->MusBuffer = (BYTE *)0x0;
  iVar2 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,front,0x20);
  if (CONCAT44(extraout_var,iVar2) == 0x20) {
    uVar3 = MUSHeaderSearch(front,0x20);
    if (-1 < (int)uVar3) {
      iVar2 = (int)reader->Length;
      uVar7 = iVar2 - uVar3;
      if (7 < (int)uVar7) {
        pMVar5 = (MUSHeader *)operator_new__((ulong)uVar7);
        uVar6 = (ulong)uVar3;
        this->MusHeader = pMVar5;
        memcpy(pMVar5,front + uVar6,0x20 - uVar6);
        iVar4 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                          (reader,(long)pMVar5 + (0x20 - uVar6),(ulong)uVar7 - (0x20 - uVar6));
        if ((CONCAT44(extraout_var_00,iVar4) == (long)(iVar2 + -0x20)) &&
           (pMVar5 = this->MusHeader, pMVar5->NumChans < 0x10)) {
          uVar1 = pMVar5->SongStart;
          this->MusBuffer = (BYTE *)((long)&pMVar5->Magic + (ulong)uVar1);
          uVar7 = uVar7 - uVar1;
          if ((int)(uint)pMVar5->SongLen < (int)uVar7) {
            uVar7 = (uint)pMVar5->SongLen;
          }
          this->MaxMusP = (long)(int)uVar7;
          (this->super_MIDIStreamer).Division = 0x8c;
          (this->super_MIDIStreamer).InitialTempo = 1000000;
        }
      }
    }
  }
  return;
}

Assistant:

MUSSong2::MUSSong2 (FileReader &reader, EMidiDevice type, const char *args)
: MIDIStreamer(type, args), MusHeader(0), MusBuffer(0)
{
#ifdef _WIN32
	if (ExitEvent == NULL)
	{
		return;
	}
#endif

	BYTE front[32];
	int start;

	if (reader.Read(front, sizeof(front)) != sizeof(front))
	{
		return;
	}

	// To tolerate sloppy wads (diescum.wad, I'm looking at you), we search
	// the first 32 bytes of the file for a signature. My guess is that DMX
	// does no validation whatsoever and just assumes it was passed a valid
	// MUS file, since where the header is offset affects how it plays.
	start = MUSHeaderSearch(front, sizeof(front));
	if (start < 0)
	{
		return;
	}

	// Read the remainder of the song.
	int len = int(reader.GetLength() - start);
	if (len < (int)sizeof(MusHeader))
	{ // It's too short.
		return;
	}
	MusHeader = (MUSHeader *)new BYTE[len];
    memcpy(MusHeader, front + start, sizeof(front) - start);
    if (reader.Read((BYTE *)MusHeader + sizeof(front) - start, len - (sizeof(front) - start)) != (len - (32 - start)))
    {
        return;
    }

	// Do some validation of the MUS file.
	if (LittleShort(MusHeader->NumChans) > 15)
	{
		return;
	}

	MusBuffer = (BYTE *)MusHeader + LittleShort(MusHeader->SongStart);
	MaxMusP = MIN<int>(LittleShort(MusHeader->SongLen), len - LittleShort(MusHeader->SongStart));
	Division = 140;
	InitialTempo = 1000000;
}